

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ReLU_x86_avx512::forward_inplace(ReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  byte bVar22;
  byte bVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [64];
  int iVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  ushort uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  
  iVar28 = bottom_top_blob->elempack;
  if ((iVar28 == 0) || (iVar24 = (int)bottom_top_blob->elemsize << 3, iVar24 / iVar28 != 8)) {
    uVar25 = iVar28 * bottom_top_blob->w * bottom_top_blob->h * bottom_top_blob->d;
    uVar3 = bottom_top_blob->c;
    if ((this->super_ReLU).slope == 0.0) {
      if (0 < (int)uVar3) {
        uVar26 = 0;
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          pauVar27 = (undefined1 (*) [64])
                     (bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          if ((int)uVar25 < 0x10) {
            uVar31 = 0;
          }
          else {
            iVar28 = 0xf;
            do {
              auVar36 = vmaxps_avx512f(ZEXT464(0) << 0x40,*pauVar27);
              *pauVar27 = auVar36;
              pauVar27 = pauVar27 + 1;
              iVar28 = iVar28 + 0x10;
              uVar31 = uVar25 & 0xfffffff0;
            } while (iVar28 < (int)uVar25);
          }
          uVar30 = uVar31 | 7;
          while ((int)uVar30 < (int)uVar25) {
            auVar40 = vmaxps_avx(ZEXT832(0),*(undefined1 (*) [32])*pauVar27);
            *(undefined1 (*) [32])*pauVar27 = auVar40;
            pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x20);
            uVar30 = uVar31 + 0xf;
            uVar31 = uVar31 + 8;
          }
          uVar30 = uVar31 | 3;
          while ((int)uVar30 < (int)uVar25) {
            auVar39 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*pauVar27);
            *(undefined1 (*) [16])*pauVar27 = auVar39;
            pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x10);
            uVar30 = uVar31 + 7;
            uVar31 = uVar31 + 4;
          }
          if ((int)uVar31 < (int)uVar25) {
            auVar36 = vpbroadcastq_avx512f();
            uVar29 = 0;
            do {
              auVar37 = vpbroadcastq_avx512f();
              auVar38 = vporq_avx512f(auVar37,auVar34);
              auVar37 = vporq_avx512f(auVar37,auVar35);
              uVar21 = vpcmpuq_avx512f(auVar37,auVar36,2);
              bVar22 = (byte)uVar21;
              uVar21 = vpcmpuq_avx512f(auVar38,auVar36,2);
              bVar23 = (byte)uVar21;
              uVar33 = CONCAT11(bVar23,bVar22);
              piVar1 = (int *)(*pauVar27 + uVar29 * 4);
              auVar38._4_4_ = (uint)((byte)(uVar33 >> 1) & 1) * piVar1[1];
              auVar38._0_4_ = (uint)(bVar22 & 1) * *piVar1;
              auVar38._8_4_ = (uint)((byte)(uVar33 >> 2) & 1) * piVar1[2];
              auVar38._12_4_ = (uint)((byte)(uVar33 >> 3) & 1) * piVar1[3];
              auVar38._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * piVar1[4];
              auVar38._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * piVar1[5];
              auVar38._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * piVar1[6];
              auVar38._28_4_ = (uint)((byte)(uVar33 >> 7) & 1) * piVar1[7];
              auVar38._32_4_ = (uint)(bVar23 & 1) * piVar1[8];
              auVar38._36_4_ = (uint)(bVar23 >> 1 & 1) * piVar1[9];
              auVar38._40_4_ = (uint)(bVar23 >> 2 & 1) * piVar1[10];
              auVar38._44_4_ = (uint)(bVar23 >> 3 & 1) * piVar1[0xb];
              auVar38._48_4_ = (uint)(bVar23 >> 4 & 1) * piVar1[0xc];
              auVar38._52_4_ = (uint)(bVar23 >> 5 & 1) * piVar1[0xd];
              auVar38._56_4_ = (uint)(bVar23 >> 6 & 1) * piVar1[0xe];
              auVar38._60_4_ = (uint)(bVar23 >> 7) * piVar1[0xf];
              auVar37 = vmaxps_avx512f(auVar38,ZEXT464(0) << 0x40);
              puVar2 = (uint *)(*pauVar27 + uVar29 * 4);
              bVar4 = (bool)((byte)(uVar33 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar33 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar33 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar33 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar33 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar33 >> 7) & 1);
              bVar11 = (bool)(bVar23 >> 1 & 1);
              bVar12 = (bool)(bVar23 >> 2 & 1);
              bVar13 = (bool)(bVar23 >> 3 & 1);
              bVar14 = (bool)(bVar23 >> 4 & 1);
              bVar15 = (bool)(bVar23 >> 5 & 1);
              bVar16 = (bool)(bVar23 >> 6 & 1);
              *puVar2 = (uint)(bVar22 & 1) * auVar37._0_4_ | (uint)!(bool)(bVar22 & 1) * *puVar2;
              puVar2[1] = (uint)bVar4 * auVar37._4_4_ | (uint)!bVar4 * puVar2[1];
              puVar2[2] = (uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * puVar2[2];
              puVar2[3] = (uint)bVar6 * auVar37._12_4_ | (uint)!bVar6 * puVar2[3];
              puVar2[4] = (uint)bVar7 * auVar37._16_4_ | (uint)!bVar7 * puVar2[4];
              puVar2[5] = (uint)bVar8 * auVar37._20_4_ | (uint)!bVar8 * puVar2[5];
              puVar2[6] = (uint)bVar9 * auVar37._24_4_ | (uint)!bVar9 * puVar2[6];
              puVar2[7] = (uint)bVar10 * auVar37._28_4_ | (uint)!bVar10 * puVar2[7];
              puVar2[8] = (uint)(bVar23 & 1) * auVar37._32_4_ |
                          (uint)!(bool)(bVar23 & 1) * puVar2[8];
              puVar2[9] = (uint)bVar11 * auVar37._36_4_ | (uint)!bVar11 * puVar2[9];
              puVar2[10] = (uint)bVar12 * auVar37._40_4_ | (uint)!bVar12 * puVar2[10];
              puVar2[0xb] = (uint)bVar13 * auVar37._44_4_ | (uint)!bVar13 * puVar2[0xb];
              puVar2[0xc] = (uint)bVar14 * auVar37._48_4_ | (uint)!bVar14 * puVar2[0xc];
              puVar2[0xd] = (uint)bVar15 * auVar37._52_4_ | (uint)!bVar15 * puVar2[0xd];
              puVar2[0xe] = (uint)bVar16 * auVar37._56_4_ | (uint)!bVar16 * puVar2[0xe];
              puVar2[0xf] = (uint)(bVar23 >> 7) * auVar37._60_4_ |
                            (uint)!(bool)(bVar23 >> 7) * puVar2[0xf];
              uVar29 = uVar29 + 0x10;
            } while (((ulong)(~uVar31 + uVar25) + 0x10 & 0xfffffffffffffff0) != uVar29);
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar3);
      }
    }
    else if (0 < (int)uVar3) {
      uVar26 = 0;
      do {
        pauVar27 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar26 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar34 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_ReLU).slope));
        if ((int)uVar25 < 0x10) {
          uVar31 = 0;
        }
        else {
          iVar28 = 0xf;
          do {
            auVar35 = *pauVar27;
            uVar29 = vcmpps_avx512f(auVar35,ZEXT464(0) << 0x40,1);
            auVar36 = vmulps_avx512f(auVar35,auVar34);
            bVar4 = (bool)((byte)uVar29 & 1);
            auVar37._0_4_ = (uint)bVar4 * auVar36._0_4_ | (uint)!bVar4 * auVar35._0_4_;
            bVar4 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar37._4_4_ = (uint)bVar4 * auVar36._4_4_ | (uint)!bVar4 * auVar35._4_4_;
            bVar4 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar37._8_4_ = (uint)bVar4 * auVar36._8_4_ | (uint)!bVar4 * auVar35._8_4_;
            bVar4 = (bool)((byte)(uVar29 >> 3) & 1);
            auVar37._12_4_ = (uint)bVar4 * auVar36._12_4_ | (uint)!bVar4 * auVar35._12_4_;
            bVar4 = (bool)((byte)(uVar29 >> 4) & 1);
            auVar37._16_4_ = (uint)bVar4 * auVar36._16_4_ | (uint)!bVar4 * auVar35._16_4_;
            bVar4 = (bool)((byte)(uVar29 >> 5) & 1);
            auVar37._20_4_ = (uint)bVar4 * auVar36._20_4_ | (uint)!bVar4 * auVar35._20_4_;
            bVar4 = (bool)((byte)(uVar29 >> 6) & 1);
            auVar37._24_4_ = (uint)bVar4 * auVar36._24_4_ | (uint)!bVar4 * auVar35._24_4_;
            bVar4 = (bool)((byte)(uVar29 >> 7) & 1);
            auVar37._28_4_ = (uint)bVar4 * auVar36._28_4_ | (uint)!bVar4 * auVar35._28_4_;
            bVar4 = (bool)((byte)(uVar29 >> 8) & 1);
            auVar37._32_4_ = (uint)bVar4 * auVar36._32_4_ | (uint)!bVar4 * auVar35._32_4_;
            bVar4 = (bool)((byte)(uVar29 >> 9) & 1);
            auVar37._36_4_ = (uint)bVar4 * auVar36._36_4_ | (uint)!bVar4 * auVar35._36_4_;
            bVar4 = (bool)((byte)(uVar29 >> 10) & 1);
            auVar37._40_4_ = (uint)bVar4 * auVar36._40_4_ | (uint)!bVar4 * auVar35._40_4_;
            bVar4 = (bool)((byte)(uVar29 >> 0xb) & 1);
            auVar37._44_4_ = (uint)bVar4 * auVar36._44_4_ | (uint)!bVar4 * auVar35._44_4_;
            bVar4 = (bool)((byte)(uVar29 >> 0xc) & 1);
            auVar37._48_4_ = (uint)bVar4 * auVar36._48_4_ | (uint)!bVar4 * auVar35._48_4_;
            bVar4 = (bool)((byte)(uVar29 >> 0xd) & 1);
            auVar37._52_4_ = (uint)bVar4 * auVar36._52_4_ | (uint)!bVar4 * auVar35._52_4_;
            bVar4 = (bool)((byte)(uVar29 >> 0xe) & 1);
            auVar37._56_4_ = (uint)bVar4 * auVar36._56_4_ | (uint)!bVar4 * auVar35._56_4_;
            bVar4 = SUB81(uVar29 >> 0xf,0);
            auVar37._60_4_ = (uint)bVar4 * auVar36._60_4_ | (uint)!bVar4 * auVar35._60_4_;
            *pauVar27 = auVar37;
            pauVar27 = pauVar27 + 1;
            iVar28 = iVar28 + 0x10;
          } while (iVar28 < (int)uVar25);
          auVar34 = ZEXT464((uint)(this->super_ReLU).slope);
          uVar31 = uVar25 & 0xfffffff0;
        }
        auVar40._0_4_ = auVar34._0_4_;
        if ((int)(uVar31 | 7) < (int)uVar25) {
          auVar40._4_4_ = auVar40._0_4_;
          auVar40._8_4_ = auVar40._0_4_;
          auVar40._12_4_ = auVar40._0_4_;
          auVar40._16_4_ = auVar40._0_4_;
          auVar40._20_4_ = auVar40._0_4_;
          auVar40._24_4_ = auVar40._0_4_;
          auVar40._28_4_ = auVar40._0_4_;
          uVar30 = uVar31;
          do {
            auVar18 = vmaxps_avx(*(undefined1 (*) [32])*pauVar27,ZEXT832(0));
            auVar20 = vminps_avx(*(undefined1 (*) [32])*pauVar27,ZEXT832(0));
            auVar39 = vfmadd213ps_fma(auVar20,auVar40,auVar18);
            *(undefined1 (*) [32])*pauVar27 = ZEXT1632(auVar39);
            pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x20);
            uVar31 = uVar30 + 8;
            iVar28 = uVar30 + 0xf;
            uVar30 = uVar31;
          } while (iVar28 < (int)uVar25);
          auVar40._0_4_ = (this->super_ReLU).slope;
        }
        if ((int)(uVar31 | 3) < (int)uVar25) {
          auVar39._4_4_ = auVar40._0_4_;
          auVar39._0_4_ = auVar40._0_4_;
          auVar39._8_4_ = auVar40._0_4_;
          auVar39._12_4_ = auVar40._0_4_;
          uVar30 = uVar31;
          do {
            auVar17 = vmaxps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0));
            auVar19 = vminps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0));
            auVar17 = vfmadd213ps_fma(auVar19,auVar39,auVar17);
            *(undefined1 (*) [16])*pauVar27 = auVar17;
            pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x10);
            uVar31 = uVar30 + 4;
            iVar28 = uVar30 + 7;
            uVar30 = uVar31;
          } while (iVar28 < (int)uVar25);
        }
        if (uVar25 - uVar31 != 0 && (int)uVar31 <= (int)uVar25) {
          lVar32 = 0;
          do {
            if (*(float *)(*pauVar27 + lVar32 * 4) < 0.0) {
              *(float *)(*pauVar27 + lVar32 * 4) =
                   *(float *)(*pauVar27 + lVar32 * 4) * (this->super_ReLU).slope;
            }
            lVar32 = lVar32 + 1;
          } while (uVar25 - uVar31 != (int)lVar32);
        }
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar3);
    }
  }
  else {
    forward_inplace_int8(this,bottom_top_blob,(Option *)((long)iVar24 % (long)iVar28 & 0xffffffff));
  }
  return 0;
}

Assistant:

int ReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}